

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O0

void __thiscall
xmrig::SelfSelectClient::SelfSelectClient
          (SelfSelectClient *this,int id,char *agent,IClientListener *listener)

{
  _func_int **pp_Var1;
  _func_int **in_RCX;
  IClient *in_RDI;
  char *unaff_retaddr;
  int in_stack_0000000c;
  Client *in_stack_00000010;
  Job *in_stack_ffffffffffffffd0;
  IClient *listener_00;
  
  listener_00 = in_RDI;
  IClient::IClient(in_RDI);
  IClientListener::IClientListener((IClientListener *)(in_RDI + 1));
  IHttpListener::IHttpListener((IHttpListener *)(in_RDI + 2));
  in_RDI->_vptr_IClient = (_func_int **)&PTR__SelfSelectClient_002b7aa0;
  in_RDI[1]._vptr_IClient = (_func_int **)&PTR__SelfSelectClient_002b7bb0;
  in_RDI[2]._vptr_IClient = (_func_int **)&PTR__SelfSelectClient_002b7bf8;
  *(undefined1 *)&in_RDI[3]._vptr_IClient = 0;
  *(undefined1 *)((long)&in_RDI[3]._vptr_IClient + 1) = 0;
  in_RDI[5]._vptr_IClient = in_RCX;
  *(undefined4 *)&in_RDI[6]._vptr_IClient = 5;
  in_RDI[7]._vptr_IClient = (_func_int **)0x0;
  in_RDI[8]._vptr_IClient = (_func_int **)0x1;
  Job::Job(in_stack_ffffffffffffffd0);
  *(undefined4 *)&in_RDI[0x2a]._vptr_IClient = 0;
  in_RDI[0x2b]._vptr_IClient = (_func_int **)0x1388;
  in_RDI[0x2c]._vptr_IClient = (_func_int **)0x0;
  pp_Var1 = (_func_int **)operator_new(0x4ae8);
  Client::Client(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(IClientListener *)listener_00);
  in_RDI[4]._vptr_IClient = pp_Var1;
  return;
}

Assistant:

xmrig::SelfSelectClient::SelfSelectClient(int id, const char *agent, IClientListener *listener) :
    m_listener(listener)
{
    m_client = new Client(id, agent, this);
}